

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::DisallowedItem(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
                 *this,SizeType index)

{
  Number NVar1;
  StringRefType *pSVar2;
  CrtAllocator *pCVar3;
  Data local_38;
  StringRefType local_28;
  
  NVar1._4_1_ = '\0';
  NVar1._5_1_ = '\0';
  NVar1._6_1_ = '\0';
  NVar1._7_1_ = '\0';
  NVar1.u.u = index;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue(&this->currentError_);
  (this->currentError_).data_.n = (Number)0x0;
  (this->currentError_).data_.s.str = (Ch *)0x0;
  (this->currentError_).data_.f.flags = 3;
  pSVar2 = GetDisallowedString();
  local_28.s = pSVar2->s;
  local_28.length = pSVar2->length;
  local_38.s.str = (Ch *)((ulong)(-1 < (int)index) << 0x35 | 0x1d6000000000000);
  local_38.n = NVar1;
  if (this->stateAllocator_ == (CrtAllocator *)0x0) {
    pCVar3 = (CrtAllocator *)operator_new(1);
    this->ownStateAllocator_ = pCVar3;
    this->stateAllocator_ = pCVar3;
  }
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
            (&this->currentError_,&local_28,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_38.s,
             this->stateAllocator_);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_38.s);
  AddCurrentError(this,kValidateErrorAdditionalItems,true);
  return;
}

Assistant:

void DisallowedItem(SizeType index) {
        currentError_.SetObject();
        currentError_.AddMember(GetDisallowedString(), ValueType(index).Move(), GetStateAllocator());
        AddCurrentError(kValidateErrorAdditionalItems, true);
    }